

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void vmaDestroyVirtualBlock(VmaVirtualBlock virtualBlock)

{
  void *pvVar1;
  PFN_vkFreeFunction UNRECOVERED_JUMPTABLE;
  
  if (virtualBlock == (VmaVirtualBlock)0x0) {
    return;
  }
  pvVar1 = (virtualBlock->m_AllocationCallbacks).pUserData;
  UNRECOVERED_JUMPTABLE = (virtualBlock->m_AllocationCallbacks).pfnFree;
  VmaVirtualBlock_T::~VmaVirtualBlock_T(virtualBlock);
  if (UNRECOVERED_JUMPTABLE != (PFN_vkFreeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(pvVar1,virtualBlock);
    return;
  }
  free(virtualBlock);
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyVirtualBlock(VmaVirtualBlock VMA_NULLABLE virtualBlock)
{
    if(virtualBlock != VK_NULL_HANDLE)
    {
        VMA_DEBUG_LOG("vmaDestroyVirtualBlock");
        VMA_DEBUG_GLOBAL_MUTEX_LOCK;
        VkAllocationCallbacks allocationCallbacks = virtualBlock->m_AllocationCallbacks; // Have to copy the callbacks when destroying.
        vma_delete(&allocationCallbacks, virtualBlock);
    }
}